

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O3

char * MULTILABEL::bufread_label(labels *ld,char *c,io_buf *cache)

{
  size_t sVar1;
  long lVar2;
  uint32_t temp;
  uint *local_30;
  uint local_24;
  
  lVar2 = *(long *)c;
  v_array<unsigned_int>::clear(&ld->label_v);
  local_30 = (uint *)(c + 8);
  sVar1 = io_buf::buf_read(cache,(char **)&local_30,(lVar2 << 0x22) >> 0x20);
  if (sVar1 < (ulong)(lVar2 * 4)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error in demarshal of cost data",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  else if (lVar2 != 0) {
    do {
      local_24 = *local_30;
      local_30 = local_30 + 1;
      v_array<unsigned_int>::push_back(&ld->label_v,&local_24);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return (char *)local_30;
}

Assistant:

char* bufread_label(labels* ld, char* c, io_buf& cache)
{
  size_t num = *(size_t*)c;
  ld->label_v.clear();
  c += sizeof(size_t);
  size_t total = sizeof(uint32_t) * num;
  if (cache.buf_read(c, (int)total) < total)
  {
    cout << "error in demarshal of cost data" << endl;
    return c;
  }
  for (size_t i = 0; i < num; i++)
  {
    uint32_t temp = *(uint32_t*)c;
    c += sizeof(uint32_t);
    ld->label_v.push_back(temp);
  }

  return c;
}